

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O0

void __thiscall
libtorrent::dht::dht_tracker::sample_infohashes
          (dht_tracker *this,endpoint *ep,sha1_hash *target,
          function<void_(libtorrent::digest32<160L>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_int,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>,_std::vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>)>
          *f)

{
  bool bVar1;
  tracker_node *this_00;
  function<void_(libtorrent::digest32<160L>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_int,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>,_std::vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>)>
  local_90;
  address local_70;
  udp local_50;
  udp local_4c;
  reference local_48;
  pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node> *n;
  iterator __end2;
  iterator __begin2;
  tracker_nodes_t *__range2;
  function<void_(libtorrent::digest32<160L>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_int,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>,_std::vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>)>
  *f_local;
  sha1_hash *target_local;
  endpoint *ep_local;
  dht_tracker *this_local;
  
  __end2 = ::std::
           map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
           ::begin(&this->m_nodes);
  n = (pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>
       *)::std::
         map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
         ::end(&this->m_nodes);
  while( true ) {
    bVar1 = ::std::operator!=(&__end2,(_Self *)&n);
    if (!bVar1) {
      return;
    }
    local_48 = ::std::
               _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
               ::operator*(&__end2);
    local_4c.family_ = (int)boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::protocol(ep);
    libtorrent::aux::listen_socket_handle::get_external_address(&local_70,&local_48->first);
    bVar1 = boost::asio::ip::address::is_v4(&local_70);
    if (bVar1) {
      local_50 = boost::asio::ip::udp::v4();
    }
    else {
      local_50 = boost::asio::ip::udp::v6();
    }
    bVar1 = boost::asio::ip::operator!=(&local_4c,&local_50);
    if (!bVar1) break;
    ::std::
    _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
    ::operator++(&__end2);
  }
  this_00 = &local_48->second;
  ::std::
  function<void_(libtorrent::digest32<160L>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_int,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>,_std::vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>)>
  ::function(&local_90,f);
  dht::node::sample_infohashes(&this_00->dht,ep,target,&local_90);
  ::std::
  function<void_(libtorrent::digest32<160L>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_int,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>,_std::vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>)>
  ::~function(&local_90);
  return;
}

Assistant:

void dht_tracker::sample_infohashes(udp::endpoint const& ep, sha1_hash const& target
		, std::function<void(node_id
			, time_duration
			, int, std::vector<sha1_hash>
			, std::vector<std::pair<sha1_hash, udp::endpoint>>)> f)
	{
		for (auto& n : m_nodes)
		{
			if (ep.protocol() != (n.first.get_external_address().is_v4() ? udp::v4() : udp::v6()))
				continue;
			n.second.dht.sample_infohashes(ep, target, f);
			break;
		}
	}